

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O0

void lzham::generate_polar_codes
               (uint num_syms,sym_freq_conflict *pSF,uint8 *pCodesizes,uint *max_code_size_ret)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  uint in_EDI;
  uint codesize;
  uint i_2;
  uint tree_total_bits;
  uint max_code_size;
  uint freq;
  uint i_1;
  uint start_index;
  uint tree_total;
  uint adjusted_sym_freq;
  uint sym_len;
  uint sym_freq;
  uint i;
  uint cur_total;
  uint orig_total_freq;
  int tmp_freq [600];
  uint local_9cc;
  uint local_9bc;
  uint local_9b4;
  uint local_9ac;
  uint local_9a8;
  uint local_9a4;
  uint local_994;
  uint local_990;
  uint local_98c;
  uint auStack_988 [602];
  uint *local_20;
  long local_18;
  long local_10;
  uint local_4;
  
  local_18 = CONCAT71(in_register_00000011,in_DL);
  local_98c = 0;
  local_990 = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  for (local_994 = 0; local_994 < local_4; local_994 = local_994 + 1) {
    uVar3 = (uint)*(ushort *)(local_10 + (ulong)((local_4 - 1) - local_994) * 4);
    local_98c = uVar3 + local_98c;
    uVar1 = math::total_bits(uVar3);
    uVar1 = 1 << ((char)uVar1 - 1U & 0x1f);
    auStack_988[local_994] = uVar1;
    local_990 = uVar1 + local_990;
  }
  uVar1 = math::total_bits(local_98c);
  local_9a4 = 1 << ((char)uVar1 - 1U & 0x1f);
  if (local_9a4 < local_98c) {
    local_9a4 = local_9a4 << 1;
  }
  local_9a8 = 0;
  do {
    if (local_9a4 <= local_990 || local_4 <= local_9a8) {
      local_9b4 = 0;
      uVar1 = math::total_bits(local_9a4);
      for (local_9bc = 0; local_9bc < local_4; local_9bc = local_9bc + 1) {
        uVar2 = math::total_bits(auStack_988[local_9bc]);
        uVar3 = uVar1 - uVar2;
        local_9cc = uVar3;
        if (uVar3 < local_9b4) {
          local_9cc = local_9b4;
        }
        local_9b4 = local_9cc;
        *(char *)(local_18 +
                 (ulong)*(ushort *)(local_10 + 2 + (ulong)((local_4 - 1) - local_9bc) * 4)) =
             (char)uVar3;
      }
      *local_20 = local_9b4;
      return;
    }
    for (local_9ac = local_9a8; local_9ac < local_4; local_9ac = local_9ac + 1) {
      uVar1 = auStack_988[local_9ac];
      if (local_9a4 < local_990 + uVar1) {
        local_9a8 = local_9ac + 1;
      }
      else {
        auStack_988[local_9ac] = uVar1 + auStack_988[local_9ac];
        local_990 = uVar1 + local_990;
        if (local_990 == local_9a4) break;
      }
    }
  } while( true );
}

Assistant:

void generate_polar_codes(uint num_syms, sym_freq* pSF, uint8* pCodesizes, uint& max_code_size_ret)
   {
      int tmp_freq[cPolarMaxSupportedSyms];

      uint orig_total_freq = 0;
      uint cur_total = 0;
      for (uint i = 0; i < num_syms; i++) 
      {
         uint sym_freq = pSF[num_syms - 1 - i].m_freq;
         orig_total_freq += sym_freq;

         uint sym_len = math::total_bits(sym_freq);
         uint adjusted_sym_freq = 1 << (sym_len - 1);
         tmp_freq[i] = adjusted_sym_freq;
         cur_total += adjusted_sym_freq;
      }

      uint tree_total = 1 << (math::total_bits(orig_total_freq) - 1);
      if (tree_total < orig_total_freq)
         tree_total <<= 1;

      uint start_index = 0;
      while ((cur_total < tree_total) && (start_index < num_syms))
      {
         for (uint i = start_index; i < num_syms; i++) 
         {
            uint freq = tmp_freq[i];
            if ((cur_total + freq) <= tree_total) 
            {
               tmp_freq[i] += freq;
               if ((cur_total += freq) == tree_total)
                  break;
            }
            else 
            {
               start_index = i + 1;
            }
         }
      }         

      LZHAM_ASSERT(cur_total == tree_total);

      uint max_code_size = 0;
      const uint tree_total_bits = math::total_bits(tree_total);
      for (uint i = 0; i < num_syms; i++) 
      {
         uint codesize = (tree_total_bits - math::total_bits(tmp_freq[i]));
         max_code_size = LZHAM_MAX(codesize, max_code_size);
         pCodesizes[pSF[num_syms-1-i].m_sym] = static_cast<uint8>(codesize);
      }
      max_code_size_ret = max_code_size;
   }